

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall Function_Pool::FunctionPoolTask::_processTask(FunctionPoolTask *this)

{
  uint uVar1;
  void *__stat_loc;
  undefined8 uVar2;
  AbstractTaskProvider *in_RDI;
  char *in_stack_00000008;
  imageException *in_stack_00000010;
  size_t in_stack_ffffffffffffffe8;
  TaskProviderSingleton *in_stack_fffffffffffffff0;
  
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)0x141a5f);
  __stat_loc = (void *)AreaInfo::_size((AreaInfo *)0x141a67);
  TaskProviderSingleton::_run(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  uVar1 = AbstractTaskProvider::_wait(in_RDI,__stat_loc);
  if ((uVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_00000010,in_stack_00000008);
    __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
  }
  return;
}

Assistant:

void FunctionPoolTask::_processTask()
    {
        _run( _infoIn1->_size() );

        if( !_wait() ) {
            throw imageException( "An exception raised during task execution in function pool" );
        }
    }